

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O2

void mul(int64_t *o,int64_t *a,int64_t *b)

{
  long lVar1;
  size_t i;
  long lVar2;
  long *plVar3;
  size_t i_1;
  size_t j;
  long lVar4;
  int64_t t [31];
  long local_108 [32];
  
  plVar3 = local_108;
  for (lVar2 = 0; lVar2 != 0x1f; lVar2 = lVar2 + 1) {
    local_108[lVar2] = 0;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    lVar1 = a[lVar2];
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      *(long *)((long)plVar3 + lVar4 * 8) = *(long *)((long)plVar3 + lVar4 * 8) + b[lVar4] * lVar1;
    }
    plVar3 = (long *)((long)plVar3 + 8);
  }
  for (lVar2 = 0; lVar2 != 0xf; lVar2 = lVar2 + 1) {
    local_108[lVar2] = local_108[lVar2] + local_108[lVar2 + 0x10] * 0x26;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    o[lVar2] = local_108[lVar2];
  }
  car25519(o);
  car25519(o);
  return;
}

Assistant:

static void mul(gf o, const gf a, const gf b)
{
  int64_t t[31];

  for (size_t i = 0; i < 31; i++)
    t[i] = 0;

  for (size_t i = 0; i < 16; i++)
    for (size_t j = 0; j < 16; j++)
      t[i + j] += a[i] * b[j];

  for (size_t i = 0; i < 15; i++)
    t[i] += 38 * t[i + 16];

  for (size_t i = 0; i < 16; i++)
    o[i] = t[i];

  car25519(o);
  car25519(o);
}